

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_withSmallPrefix
              (char *source,char *dest,int compressedSize,int maxOutputSize,size_t prefixSize)

{
  ushort *puVar1;
  byte *pbVar2;
  byte bVar3;
  undefined8 uVar4;
  ushort uVar5;
  ushort uVar6;
  BYTE *s_1;
  ushort *puVar7;
  long lVar8;
  uint uVar9;
  char cVar10;
  int iVar11;
  byte *pbVar12;
  byte *pbVar13;
  ushort *puVar14;
  uint uVar15;
  BYTE *d;
  byte *pbVar16;
  byte *pbVar17;
  byte *pbVar18;
  byte *pbVar19;
  ushort *puVar20;
  ulong uVar21;
  BYTE *d_1;
  BYTE *d_3;
  ulong uVar22;
  byte *pbVar23;
  ulong uStack_80;
  int local_68;
  int local_60;
  
  puVar7 = (ushort *)0xffffffffffffffff;
  if (source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        puVar7 = (ushort *)(ulong)-(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar13 = (byte *)(dest + -prefixSize);
      puVar1 = (ushort *)(source + compressedSize);
      pbVar2 = (byte *)(dest + maxOutputSize);
      puVar7 = (ushort *)source;
      pbVar16 = (byte *)dest;
      if (maxOutputSize < 0x40) goto LAB_00105961;
      puVar14 = (ushort *)((long)puVar1 - 0xf);
      puVar20 = (ushort *)source;
      pbVar18 = (byte *)source;
LAB_0010540f:
      pbVar17 = pbVar16;
      bVar3 = (byte)*puVar20;
      uVar9 = (uint)bVar3;
      puVar7 = (ushort *)((long)puVar20 + 1);
      uVar22 = (ulong)(uint)(bVar3 >> 4);
      if (bVar3 >> 4 == 0xf) {
        uVar22 = 0xf;
        puVar20 = puVar7;
        if (puVar7 < puVar14) {
          uVar15 = 0;
          do {
            uVar5 = *puVar20;
            puVar20 = (ushort *)((long)puVar20 + 1);
            uVar15 = uVar15 + (byte)uVar5;
          } while (puVar20 < puVar14 && (byte)uVar5 == 0xff);
          uVar22 = (ulong)uVar15 + 0xf;
        }
        pbVar16 = pbVar17 + uVar22;
        if (((puVar14 <= puVar7) || (CARRY8((ulong)pbVar17,uVar22))) ||
           (CARRY8((ulong)puVar20,uVar22))) {
          iVar11 = 5;
          puVar7 = puVar20;
        }
        else {
          pbVar18 = pbVar16;
          if (pbVar2 + -0x20 < pbVar16) {
            iVar11 = 6;
            puVar7 = puVar20;
          }
          else if (puVar1 + -0x10 < (ushort *)((long)puVar20 + uVar22)) {
            iVar11 = 6;
            puVar7 = puVar20;
          }
          else {
            lVar8 = 0;
            do {
              uVar4 = *(undefined8 *)((byte *)((long)puVar20 + lVar8) + 8);
              pbVar12 = pbVar17 + lVar8;
              *(undefined8 *)pbVar12 = *(undefined8 *)((long)puVar20 + lVar8);
              *(undefined8 *)(pbVar12 + 8) = uVar4;
              pbVar19 = (byte *)((long)puVar20 + lVar8 + 0x10);
              uVar4 = *(undefined8 *)(pbVar19 + 8);
              *(undefined8 *)(pbVar12 + 0x10) = *(undefined8 *)pbVar19;
              *(undefined8 *)(pbVar12 + 0x18) = uVar4;
              lVar8 = lVar8 + 0x20;
            } while (pbVar12 + 0x20 < pbVar16);
            iVar11 = 0;
            puVar7 = (ushort *)((long)puVar20 + uVar22);
            pbVar17 = pbVar16;
          }
        }
        if (iVar11 != 0) {
          if (iVar11 != 5) {
            if (iVar11 == 6) goto LAB_00105871;
            goto LAB_00105767;
          }
          goto LAB_00105a20;
        }
      }
      else {
        pbVar18 = pbVar17 + uVar22;
        if ((ushort *)((long)puVar1 - 0x11U) < puVar7) goto LAB_00105871;
        uVar4 = *(undefined8 *)((long)puVar20 + 9);
        *(undefined8 *)pbVar17 = *(undefined8 *)puVar7;
        *(undefined8 *)(pbVar17 + 8) = uVar4;
        puVar7 = (ushort *)(uVar22 + (long)puVar7);
        pbVar17 = pbVar18;
      }
      uVar5 = *puVar7;
      uVar21 = (ulong)uVar5;
      puVar7 = puVar7 + 1;
      pbVar12 = pbVar17 + -uVar21;
      uVar22 = (ulong)(bVar3 & 0xf);
      if (uVar22 == 0xf) {
        if (pbVar12 < pbVar13) {
          iVar11 = 5;
          uStack_80 = 0xf;
        }
        else {
          uVar9 = 0;
          do {
            uVar6 = *puVar7;
            puVar7 = (ushort *)((long)puVar7 + 1);
            uVar9 = uVar9 + (byte)uVar6;
          } while ((byte)uVar6 == 0xff && puVar7 < puVar1 + -2);
          uVar22 = (ulong)uVar9;
          uStack_80 = uVar22 + 0xf;
          if ((puVar1 + -2 <= puVar7) || (CARRY8((ulong)pbVar17,uStack_80))) {
            iVar11 = 5;
          }
          else {
            uStack_80 = uVar22 + 0x13;
            iVar11 = 7;
            if (pbVar17 + uVar22 + 0x13 < pbVar2 + -0x40) {
              iVar11 = 0;
            }
          }
        }
        if (iVar11 != 0) {
          if (iVar11 != 5) {
            if (iVar11 == 7) goto LAB_00105902;
            goto LAB_00105767;
          }
          goto LAB_00105a20;
        }
      }
      else {
        uStack_80 = uVar22 + 4;
        if (pbVar2 + -0x40 <= pbVar17 + uVar22 + 4) goto LAB_00105902;
        if ((pbVar13 <= pbVar12) && (7 < uVar5)) {
          *(undefined8 *)pbVar17 = *(undefined8 *)pbVar12;
          *(undefined8 *)(pbVar17 + 8) = *(undefined8 *)(pbVar12 + 8);
          *(undefined2 *)(pbVar17 + 0x10) = *(undefined2 *)(pbVar12 + 0x10);
          puVar20 = puVar7;
          pbVar16 = pbVar17 + uVar22 + 4;
          goto LAB_0010540f;
        }
      }
      if (pbVar12 < pbVar13) goto LAB_00105a20;
      pbVar18 = pbVar17 + uStack_80;
      puVar20 = puVar7;
      pbVar16 = pbVar18;
      if (uVar5 < 0x10) {
        if (uVar21 == 4) {
          iVar11 = *(int *)pbVar12;
LAB_0010567a:
          *(int *)pbVar17 = iVar11;
          *(int *)(pbVar17 + 4) = iVar11;
          if (8 < uStack_80) {
            pbVar17 = pbVar17 + 8;
            do {
              *(int *)pbVar17 = iVar11;
              *(int *)(pbVar17 + 4) = iVar11;
              pbVar17 = pbVar17 + 8;
            } while (pbVar17 < pbVar18);
          }
        }
        else {
          if (uVar5 == 2) {
            iVar11 = CONCAT22(*(undefined2 *)pbVar12,*(undefined2 *)pbVar12);
            goto LAB_0010567a;
          }
          if (uVar5 == 1) {
            iVar11 = (uint)*pbVar12 * 0x1010101;
            goto LAB_0010567a;
          }
          if (uVar5 < 8) {
            pbVar17[0] = 0;
            pbVar17[1] = 0;
            pbVar17[2] = 0;
            pbVar17[3] = 0;
            *pbVar17 = *pbVar12;
            pbVar17[1] = pbVar12[1];
            pbVar17[2] = pbVar12[2];
            pbVar17[3] = pbVar12[3];
            uVar9 = inc32table[uVar5];
            *(undefined4 *)(pbVar17 + 4) = *(undefined4 *)(pbVar12 + uVar9);
            pbVar12 = pbVar12 + ((ulong)uVar9 - (long)dec64table[uVar5]);
          }
          else {
            *(undefined8 *)pbVar17 = *(undefined8 *)pbVar12;
            pbVar12 = pbVar12 + 8;
          }
          pbVar17 = pbVar17 + 8;
          do {
            *(undefined8 *)pbVar17 = *(undefined8 *)pbVar12;
            pbVar17 = pbVar17 + 8;
            pbVar12 = pbVar12 + 8;
          } while (pbVar17 < pbVar18);
        }
      }
      else {
        do {
          uVar4 = *(undefined8 *)(pbVar17 + -uVar21 + 8);
          *(undefined8 *)pbVar17 = *(undefined8 *)(pbVar17 + -uVar21);
          *(undefined8 *)(pbVar17 + 8) = uVar4;
          uVar4 = *(undefined8 *)(pbVar17 + -uVar21 + 0x10 + 8);
          *(undefined8 *)(pbVar17 + 0x10) = *(undefined8 *)(pbVar17 + -uVar21 + 0x10);
          *(undefined8 *)(pbVar17 + 0x18) = uVar4;
          pbVar17 = pbVar17 + 0x20;
        } while (pbVar17 < pbVar18);
      }
      goto LAB_0010540f;
    }
  }
LAB_00105767:
  return (int)puVar7;
LAB_00105902:
  if (pbVar12 < pbVar13) goto LAB_00105a20;
  pbVar16 = pbVar17 + uStack_80;
  if ((uint)uVar21 < 8) {
    pbVar17[0] = 0;
    pbVar17[1] = 0;
    pbVar17[2] = 0;
    pbVar17[3] = 0;
    *pbVar17 = *pbVar12;
    pbVar17[1] = pbVar12[1];
    pbVar17[2] = pbVar12[2];
    pbVar17[3] = pbVar12[3];
    uVar21 = (ulong)((uint)uVar21 << 2);
    uVar22 = (ulong)*(uint *)((long)inc32table + uVar21);
    *(undefined4 *)(pbVar17 + 4) = *(undefined4 *)(pbVar12 + uVar22);
    pbVar12 = pbVar12 + (uVar22 - (long)*(int *)((long)dec64table + uVar21));
  }
  else {
    *(undefined8 *)pbVar17 = *(undefined8 *)pbVar12;
    pbVar12 = pbVar12 + 8;
  }
  pbVar18 = pbVar17 + 8;
  if (pbVar2 + -0xc < pbVar16) {
    iVar11 = 5;
    if (pbVar16 <= pbVar2 + -5) {
      pbVar17 = pbVar2 + -7;
      pbVar19 = pbVar12;
      pbVar23 = pbVar18;
      if (pbVar18 < pbVar17) {
        do {
          *(undefined8 *)pbVar23 = *(undefined8 *)pbVar19;
          pbVar23 = pbVar23 + 8;
          pbVar19 = pbVar19 + 8;
        } while (pbVar23 < pbVar17);
        pbVar12 = pbVar12 + ((long)pbVar17 - (long)pbVar18);
        pbVar18 = pbVar17;
      }
      iVar11 = 0;
      for (; pbVar18 < pbVar16; pbVar18 = pbVar18 + 1) {
        bVar3 = *pbVar12;
        pbVar12 = pbVar12 + 1;
        *pbVar18 = bVar3;
      }
    }
    if (iVar11 != 0) {
      if (iVar11 != 5) goto LAB_00105767;
      goto LAB_00105a20;
    }
  }
  else {
    *(undefined8 *)pbVar18 = *(undefined8 *)pbVar12;
    if (0x10 < uStack_80) {
      pbVar17 = pbVar17 + 0x10;
      do {
        pbVar12 = pbVar12 + 8;
        *(undefined8 *)pbVar17 = *(undefined8 *)pbVar12;
        pbVar17 = pbVar17 + 8;
      } while (pbVar17 < pbVar16);
    }
  }
LAB_00105961:
  bVar3 = (byte)*puVar7;
  puVar14 = (ushort *)((long)puVar7 + 1);
  while( true ) {
    uVar9 = (uint)bVar3;
    puVar7 = puVar14;
    if (bVar3 >> 4 == 0xf) break;
    uVar22 = (ulong)(uint)(bVar3 >> 4);
    if ((source + (long)compressedSize + -0x10 <= puVar14) ||
       (dest + (long)maxOutputSize + -0x20 < pbVar16)) goto LAB_0010586b;
    uVar4 = *(undefined8 *)(puVar14 + 4);
    *(undefined8 *)pbVar16 = *(undefined8 *)puVar14;
    *(undefined8 *)(pbVar16 + 8) = uVar4;
    pbVar18 = pbVar16 + uVar22;
    uStack_80 = (ulong)(uVar9 & 0xf);
    puVar7 = (ushort *)((long)puVar14 + uVar22) + 1;
    uVar5 = *(ushort *)((long)puVar14 + uVar22);
    uVar21 = (ulong)uVar5;
    pbVar12 = pbVar18 + -uVar21;
    if ((((uVar9 & 0xf) == 0xf) || (uVar5 < 8)) || (pbVar12 < pbVar13)) goto LAB_001058b6;
    *(undefined8 *)pbVar18 = *(undefined8 *)pbVar12;
    *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)(pbVar12 + 8);
    *(undefined2 *)(pbVar18 + 0x10) = *(undefined2 *)(pbVar12 + 0x10);
    pbVar16 = pbVar18 + uStack_80 + 4;
    bVar3 = *(byte *)((long)puVar14 + uVar22 + 2);
    puVar14 = (ushort *)((long)puVar14 + uVar22 + 3);
  }
  puVar20 = (ushort *)((long)puVar1 - 0xf);
  uVar22 = 0xf;
  if (puVar14 < puVar20) {
    uVar15 = 0;
    do {
      uVar5 = *puVar7;
      puVar7 = (ushort *)((long)puVar7 + 1);
      uVar15 = uVar15 + (byte)uVar5;
    } while (puVar7 < puVar20 && (byte)uVar5 == 0xff);
    uVar22 = (ulong)uVar15 + 0xf;
  }
  if (((puVar20 <= puVar14) || (CARRY8((ulong)pbVar16,uVar22))) || (CARRY8((ulong)puVar7,uVar22)))
  goto LAB_00105a20;
LAB_0010586b:
  pbVar18 = pbVar16 + uVar22;
  pbVar17 = pbVar16;
LAB_00105871:
  puVar14 = (ushort *)((long)puVar7 + uVar22);
  if ((pbVar2 + -0xc < pbVar18) || (puVar1 + -4 < puVar14)) {
    if ((puVar14 == puVar1) && (pbVar18 <= pbVar2)) {
      memmove(pbVar17,puVar7,uVar22);
      local_60 = (int)dest;
      puVar7 = (ushort *)(ulong)(uint)(((int)pbVar17 + (int)uVar22) - local_60);
      goto LAB_00105767;
    }
    goto LAB_00105a20;
  }
  do {
    *(undefined8 *)pbVar17 = *(undefined8 *)puVar7;
    pbVar17 = pbVar17 + 8;
    puVar7 = puVar7 + 4;
  } while (pbVar17 < pbVar18);
  uVar21 = (ulong)*puVar14;
  puVar7 = puVar14 + 1;
  pbVar12 = pbVar18 + -uVar21;
  uStack_80 = (ulong)(uVar9 & 0xf);
LAB_001058b6:
  if ((int)uStack_80 == 0xf) {
    uVar9 = 0;
    do {
      uVar5 = *puVar7;
      puVar7 = (ushort *)((long)puVar7 + 1);
      uVar9 = uVar9 + (byte)uVar5;
    } while (puVar7 < puVar1 + -2 && (byte)uVar5 == 0xff);
    uStack_80 = (ulong)uVar9 + 0xf;
    cVar10 = '\x05';
    if (puVar7 < puVar1 + -2) {
      cVar10 = CARRY8((ulong)pbVar18,uStack_80) * '\x05';
    }
    if (cVar10 != '\0') {
      if (cVar10 != '\x05') goto LAB_00105767;
      goto LAB_00105a20;
    }
  }
  uStack_80 = uStack_80 + 4;
  pbVar17 = pbVar18;
  goto LAB_00105902;
LAB_00105a20:
  local_68 = (int)source;
  puVar7 = (ushort *)(ulong)(~(uint)puVar7 + local_68);
  goto LAB_00105767;
}

Assistant:

LZ4_FORCE_O2
static int LZ4_decompress_safe_withSmallPrefix(const char* source, char* dest, int compressedSize, int maxOutputSize,
                                               size_t prefixSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, noDict,
                                  (BYTE*)dest-prefixSize, NULL, 0);
}